

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_calc_finished_ssl(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  char *pcVar1;
  mbedtls_ssl_session *local_150;
  mbedtls_ssl_session *session;
  uchar sha1sum [20];
  uchar local_128 [8];
  uchar md5sum [16];
  uchar padbuf [48];
  undefined1 local_dc [8];
  mbedtls_sha1_context sha1;
  mbedtls_md5_context md5;
  char *sender;
  int from_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  local_150 = ssl->session_negotiate;
  if (local_150 == (mbedtls_ssl_session *)0x0) {
    local_150 = ssl->session;
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1203,"=> calc  finished ssl");
  mbedtls_md5_init((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_init((mbedtls_sha1_context *)local_dc);
  mbedtls_md5_clone((mbedtls_md5_context *)(sha1.buffer + 0x38),&ssl->handshake->fin_md5);
  mbedtls_sha1_clone((mbedtls_sha1_context *)local_dc,&ssl->handshake->fin_sha1);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1216,"finished  md5 state",(uchar *)&md5,0x10);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x121b,"finished sha1 state",(uchar *)&sha1,0x14);
  pcVar1 = "SRVR";
  if (from == 0) {
    pcVar1 = "CLNT";
  }
  md5.buffer._56_8_ = pcVar1;
  memset(md5sum + 8,0x36,0x30);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),(uchar *)md5.buffer._56_8_,4);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),local_150->master,0x30);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),md5sum + 8,0x30);
  mbedtls_md5_finish((mbedtls_md5_context *)(sha1.buffer + 0x38),local_128);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_dc,(uchar *)md5.buffer._56_8_,4);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_dc,local_150->master,0x30);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_dc,md5sum + 8,0x28);
  mbedtls_sha1_finish((mbedtls_sha1_context *)local_dc,(uchar *)&session);
  memset(md5sum + 8,0x5c,0x30);
  mbedtls_md5_starts((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),local_150->master,0x30);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),md5sum + 8,0x30);
  mbedtls_md5_update((mbedtls_md5_context *)(sha1.buffer + 0x38),local_128,0x10);
  mbedtls_md5_finish((mbedtls_md5_context *)(sha1.buffer + 0x38),buf);
  mbedtls_sha1_starts((mbedtls_sha1_context *)local_dc);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_dc,local_150->master,0x30);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_dc,md5sum + 8,0x28);
  mbedtls_sha1_update((mbedtls_sha1_context *)local_dc,(uchar *)&session,0x14);
  mbedtls_sha1_finish((mbedtls_sha1_context *)local_dc,buf + 0x10);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x123b,"calc finished result",buf,0x24);
  mbedtls_md5_free((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_free((mbedtls_sha1_context *)local_dc);
  mbedtls_zeroize(md5sum + 8,0x30);
  mbedtls_zeroize(local_128,0x10);
  mbedtls_zeroize(&session,0x14);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1244,"<= calc  finished");
  return;
}

Assistant:

static void ssl_calc_finished_ssl(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    const char *sender;
    mbedtls_md5_context  md5;
    mbedtls_sha1_context sha1;

    unsigned char padbuf[48];
    unsigned char md5sum[16];
    unsigned char sha1sum[20];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished ssl" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

    /*
     * SSLv3:
     *   hash =
     *      MD5( master + pad2 +
     *          MD5( handshake + sender + master + pad1 ) )
     *   + SHA1( master + pad2 +
     *         SHA1( handshake + sender + master + pad1 ) )
     */

#if !defined(MBEDTLS_MD5_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished  md5 state", (unsigned char *)
                    md5.state, sizeof(  md5.state ) );
#endif

#if !defined(MBEDTLS_SHA1_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha1 state", (unsigned char *)
                   sha1.state, sizeof( sha1.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT ) ? "CLNT"
                                       : "SRVR";

    memset( padbuf, 0x36, 48 );

    mbedtls_md5_update( &md5, (const unsigned char *) sender, 4 );
    mbedtls_md5_update( &md5, session->master, 48 );
    mbedtls_md5_update( &md5, padbuf, 48 );
    mbedtls_md5_finish( &md5, md5sum );

    mbedtls_sha1_update( &sha1, (const unsigned char *) sender, 4 );
    mbedtls_sha1_update( &sha1, session->master, 48 );
    mbedtls_sha1_update( &sha1, padbuf, 40 );
    mbedtls_sha1_finish( &sha1, sha1sum );

    memset( padbuf, 0x5C, 48 );

    mbedtls_md5_starts( &md5 );
    mbedtls_md5_update( &md5, session->master, 48 );
    mbedtls_md5_update( &md5, padbuf, 48 );
    mbedtls_md5_update( &md5, md5sum, 16 );
    mbedtls_md5_finish( &md5, buf );

    mbedtls_sha1_starts( &sha1 );
    mbedtls_sha1_update( &sha1, session->master, 48 );
    mbedtls_sha1_update( &sha1, padbuf , 40 );
    mbedtls_sha1_update( &sha1, sha1sum, 20 );
    mbedtls_sha1_finish( &sha1, buf + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, 36 );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    mbedtls_zeroize(  padbuf, sizeof(  padbuf ) );
    mbedtls_zeroize(  md5sum, sizeof(  md5sum ) );
    mbedtls_zeroize( sha1sum, sizeof( sha1sum ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}